

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::PrepareZ
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *y,
          TPZFMatrix<TPZFlopCounter> *z,TPZFlopCounter beta,int opt)

{
  bool bVar1;
  TPZFlopCounter *pTVar2;
  int in_ECX;
  TPZFMatrix<TPZFlopCounter> *in_RDX;
  TPZFMatrix<TPZFlopCounter> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t i;
  TPZFlopCounter *yp;
  TPZFlopCounter *zlast;
  TPZFlopCounter *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  int64_t local_90;
  double in_stack_ffffffffffffff80;
  TPZFlopCounter in_stack_ffffffffffffff88;
  TPZFMatrix<TPZFlopCounter> *in_stack_ffffffffffffff90;
  double local_60;
  TPZFlopCounter local_58;
  TPZFlopCounter *local_50;
  TPZFlopCounter *local_48;
  long local_40;
  int64_t local_38;
  int64_t local_30;
  TPZFMatrix<TPZFlopCounter> *local_20;
  TPZFMatrix<TPZFlopCounter> *local_18;
  TPZFlopCounter local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_ECX == 0) {
    local_90 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_90 = TPZBaseMatrix::Cols(in_RDI);
  }
  local_30 = local_90;
  local_38 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_18);
  (*(local_20->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local_20,local_30,local_38);
  for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
    local_48 = TPZFMatrix<TPZFlopCounter>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88.fVal,
                          (int64_t)in_stack_ffffffffffffff80);
    local_50 = local_48 + local_30;
    local_60 = 0.0;
    TPZFlopCounter::TPZFlopCounter(&local_58,&local_60);
    bVar1 = TPZFlopCounter::operator!=(&local_8,&local_58);
    if (bVar1) {
      pTVar2 = TPZFMatrix<TPZFlopCounter>::g(local_18,0,local_40);
      if (local_20 != local_18) {
        memcpy(local_48,pTVar2,local_30 << 3);
      }
      for (in_stack_ffffffffffffff90 = (TPZFMatrix<TPZFlopCounter> *)0x0;
          (long)in_stack_ffffffffffffff90 < local_30;
          in_stack_ffffffffffffff90 =
               (TPZFMatrix<TPZFlopCounter> *)
               ((long)&(in_stack_ffffffffffffff90->super_TPZMatrix<TPZFlopCounter>).
                       super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1)) {
        pTVar2 = TPZFMatrix<TPZFlopCounter>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88.fVal,
                            (int64_t)in_stack_ffffffffffffff80);
        TPZFlopCounter::operator*=(pTVar2,&local_8);
      }
    }
    else {
      for (; local_48 != local_50; local_48 = local_48 + 1) {
        in_stack_ffffffffffffff80 = 0.0;
        TPZFlopCounter::TPZFlopCounter
                  ((TPZFlopCounter *)&stack0xffffffffffffff88,(double *)&stack0xffffffffffffff80);
        local_48->fVal = in_stack_ffffffffffffff88.fVal;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}